

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line.cpp
# Opt level: O1

void __thiscall kiste::line_data_t::enforce_trailing_text_segment(line_data_t *this)

{
  undefined1 local_40 [16];
  _Alloc_hider local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  
  enforce_at_least_one_segment(this);
  if ((this->_segments).super__Vector_base<kiste::segment_t,_std::allocator<kiste::segment_t>_>.
      _M_impl.super__Vector_impl_data._M_finish[-1]._type != text) {
    local_40._0_8_ = 0;
    local_40._8_4_ = text;
    local_30._M_p = (pointer)&local_20;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"");
    std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::emplace_back<kiste::segment_t>
              (&this->_segments,(segment_t *)local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_p != &local_20) {
      operator_delete(local_30._M_p,local_20._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

auto line_data_t::enforce_trailing_text_segment() -> void
  {
    enforce_at_least_one_segment();
    if (_segments.back()._type != segment_type::text)
    {
      _segments.push_back({0, segment_type::text, ""});
    }
  }